

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

TIntermNode * __thiscall
glslang::TParseContext::declareVariable
          (TParseContext *this,TSourceLoc *loc,TString *identifier,TPublicType *publicType,
          TArraySizes *arraySizes,TIntermTyped *initializer)

{
  int *piVar1;
  TBasicType TVar2;
  TVector<glslang::TArraySize> *pTVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  TTypeParameters *pTVar7;
  TString *pTVar8;
  TSymbol *pTVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TIntermNode *pTVar10;
  char *pcVar11;
  TIntermTyped *pTVar12;
  TArraySizes *pTVar13;
  TQualifier *qualifier;
  TType type;
  TSymbol *symbol;
  
  pTVar12 = (TIntermTyped *)arraySizes;
  TType::TType(&type,publicType);
  type.arraySizes = arraySizes;
  TType::copyArrayInnerSizes(&type,publicType->arraySizes);
  arrayOfArrayVersionCheck(this,loc,type.arraySizes);
  if (initializer != (TIntermTyped *)0x0) {
    if ((type._8_4_ & 0xff) == 0x13) {
      pcVar11 = "ray queries can only be initialized by using the rayQueryInitializeEXT intrinsic:";
    }
    else {
      if ((type._8_4_ & 0xff) != 0x14) goto LAB_00422cd0;
      pcVar11 = "hit objects cannot be initialized using initializers";
    }
    pTVar12 = (TIntermTyped *)(identifier->_M_dataplus)._M_p;
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,pcVar11,"=");
  }
LAB_00422cd0:
  if (((uint)type._8_4_ >> 0x16 & 1) == 0) {
    if (((uint)type._8_4_ >> 0x15 & 1) == 0) {
      iVar5 = (*type._vptr_TType[7])();
      if (iVar5 == 0x17) {
        pcVar11 = "expected 1-2 type parameters";
        if ((publicType->typeParameters != (TTypeParameters *)0x0) &&
           ((pTVar3 = (publicType->typeParameters->arraySizes->sizes).sizes,
            pTVar3 == (TVector<glslang::TArraySize> *)0x0 ||
            ((int)((ulong)((long)(pTVar3->
                                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ).
                                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pTVar3->
                                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ).
                                super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4) < 3))))
        goto LAB_00423056;
      }
      else {
        iVar5 = (*type._vptr_TType[7])();
        if (iVar5 == 0x18) {
          pcVar11 = "expected 1-7 type parameters";
          if ((publicType->typeParameters != (TTypeParameters *)0x0) &&
             ((pTVar3 = (publicType->typeParameters->arraySizes->sizes).sizes,
              pTVar3 == (TVector<glslang::TArraySize> *)0x0 ||
              ((int)((ulong)((long)(pTVar3->
                                   super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                   ).
                                   super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pTVar3->
                                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ).
                                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) < 8))))
          goto LAB_00423056;
        }
        else if ((type._8_4_ & 0x8000000) == 0) {
          if (((publicType->typeParameters == (TTypeParameters *)0x0) ||
              (pTVar3 = (publicType->typeParameters->arraySizes->sizes).sizes,
              pTVar3 == (TVector<glslang::TArraySize> *)0x0)) ||
             ((int)((ulong)((long)(pTVar3->
                                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ).
                                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar3->
                                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ).
                                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) == 0))
          goto LAB_00423056;
          pcVar11 = "unexpected type parameters";
        }
        else {
          TIntermediate::setUseVulkanMemoryModel
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate);
          ((this->super_TParseContextBase).super_TParseVersions.intermediate)->useStorageBuffer =
               true;
          pcVar11 = "expected two type parameters";
          if ((((publicType->typeParameters != (TTypeParameters *)0x0) &&
               (pTVar13 = publicType->typeParameters->arraySizes, pTVar13 != (TArraySizes *)0x0)) &&
              (pTVar3 = (pTVar13->sizes).sizes, pTVar3 != (TVector<glslang::TArraySize> *)0x0)) &&
             (((long)(pTVar3->
                     super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                     ).
                     super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pTVar3->
                     super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                     ).
                     super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                     ._M_impl.super__Vector_impl_data._M_start & 0xffffffff0U) == 0x10)) {
            uVar6 = TSmallArrayVector::getDimSize(&pTVar13->sizes,0);
            if (0 < (int)uVar6) goto LAB_00423056;
            pcVar11 = "expected positive number of components";
          }
        }
      }
    }
    else {
      TIntermediate::setUseVulkanMemoryModel
                ((this->super_TParseContextBase).super_TParseVersions.intermediate);
      ((this->super_TParseContextBase).super_TParseVersions.intermediate)->useStorageBuffer = true;
      pcVar11 = "expected four type parameters";
      if (((publicType->typeParameters != (TTypeParameters *)0x0) &&
          (pTVar13 = publicType->typeParameters->arraySizes, pTVar13 != (TArraySizes *)0x0)) &&
         ((pTVar3 = (pTVar13->sizes).sizes, pTVar3 != (TVector<glslang::TArraySize> *)0x0 &&
          (((long)(pTVar3->
                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pTVar3->
                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                  ._M_impl.super__Vector_impl_data._M_start & 0xffffffff0U) == 0x40)))) {
        if ((((publicType->basicType - EbtFloat < 3) &&
             (uVar6 = TSmallArrayVector::getDimSize(&pTVar13->sizes,0), uVar6 != 0x10)) &&
            (uVar6 = TSmallArrayVector::getDimSize(&publicType->typeParameters->arraySizes->sizes,0)
            , uVar6 != 0x20)) &&
           (uVar6 = TSmallArrayVector::getDimSize(&publicType->typeParameters->arraySizes->sizes,0),
           uVar6 != 0x40)) {
          pTVar12 = (TIntermTyped *)0x6d490e;
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"expected 16, 32, or 64 bits for first type parameter",
                     (identifier->_M_dataplus)._M_p);
        }
        if ((((publicType->basicType - EbtInt8 & 0xfffffff9) != 0) &&
            ((publicType->basicType - EbtUint8 & 0xfffffff9) != 0)) ||
           ((uVar6 = TSmallArrayVector::getDimSize(&publicType->typeParameters->arraySizes->sizes,0)
            , uVar6 == 8 ||
            ((uVar6 = TSmallArrayVector::getDimSize
                                (&publicType->typeParameters->arraySizes->sizes,0), uVar6 == 0x10 ||
             (uVar6 = TSmallArrayVector::getDimSize
                                (&publicType->typeParameters->arraySizes->sizes,0), uVar6 == 0x20)))
            ))) goto LAB_00423056;
        pcVar11 = "expected 8, 16, or 32 bits for first type parameter";
      }
    }
  }
  else {
    TIntermediate::setUseVulkanMemoryModel
              ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    ((this->super_TParseContextBase).super_TParseVersions.intermediate)->useStorageBuffer = true;
    pTVar7 = publicType->typeParameters;
    if ((((pTVar7 == (TTypeParameters *)0x0) || (pTVar7->arraySizes == (TArraySizes *)0x0)) ||
        (pTVar3 = (pTVar7->arraySizes->sizes).sizes, pTVar3 == (TVector<glslang::TArraySize> *)0x0))
       || (((long)(pTVar3->
                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pTVar3->
                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                  ._M_impl.super__Vector_impl_data._M_start & 0xffffffff0U) != 0x40)) {
      pTVar12 = (TIntermTyped *)0x6d490e;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"unexpected number type parameters",(identifier->_M_dataplus)._M_p);
      pTVar7 = publicType->typeParameters;
      if (pTVar7 == (TTypeParameters *)0x0) goto LAB_00423056;
    }
    TVar2 = pTVar7->basicType;
    if (((TVar2 - EbtFloat < 3) || (TVar2 == EbtSpirvType)) ||
       (((TVar2 - EbtInt8 & 0xfffffff9) == 0 || ((TVar2 - EbtUint8 & 0xfffffff9) == 0))))
    goto LAB_00423056;
    pcVar11 = 
    "expected 8, 16, 32, or 64 bit signed or unsigned integer or 16, 32, or 64 bit float type";
  }
  pTVar12 = (TIntermTyped *)0x6d490e;
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc,pcVar11,(identifier->_M_dataplus)._M_p);
LAB_00423056:
  bVar4 = voidErrorCheck(this,loc,identifier,type._8_4_ & 0xff);
  if (!bVar4) {
    if (initializer == (TIntermTyped *)0x0) {
      nonInitConstCheck(this,loc,identifier,&type);
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x43])
                (this,loc,"initializer",initializer);
    }
    samplerCheck(this,loc,&type,identifier,pTVar12);
    transparentOpaqueCheck(this,loc,&type,identifier);
    atomicUintCheck(this,loc,&type,identifier);
    accStructCheck(this,loc,&type,identifier);
    hitObjectNVCheck(this,loc,&type,identifier);
    checkAndResizeMeshViewDim(this,loc,&type,false);
    if (((type.qualifier._8_4_ & 0x7f) == 2) &&
       (iVar5 = (*type._vptr_TType[0x32])(&type,0x12), (char)iVar5 != '\0')) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"variables with reference type can\'t have qualifier \'const\'",
                 "qualifier","");
    }
    if (1 < (ulong)(type.qualifier._8_4_ & 0x7f) - 5) {
      iVar5 = (*type._vptr_TType[0x32])(&type,3);
      if ((char)iVar5 != '\0') {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x15])
                  (this,loc,"qualifier",
                   "float16 types can only be in uniform block or buffer storage");
      }
      bVar4 = TType::contains16BitInt(&type);
      if (bVar4) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x18])
                  (this,loc,"qualifier",
                   "(u)int16 types can only be in uniform block or buffer storage");
      }
      bVar4 = TType::contains8BitInt(&type);
      if (bVar4) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1b])
                  (this,loc,"qualifier",
                   "(u)int8 types can only be in uniform block or buffer storage");
      }
    }
    if ((type.qualifier._8_4_ & 0x7f) == 7) {
      bVar4 = TType::
              contains<glslang::TType::containsCoopMat()const::_lambda(glslang::TType_const*)_1_>
                        (&type);
      if (bVar4) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"qualifier","Cooperative matrix types must not be used in shared memory"
                   ,"");
      }
    }
    else if ((type.qualifier._8_4_ & 0x7f) == 0xf) {
      piVar1 = &((this->super_TParseContextBase).super_TParseVersions.intermediate)->
                numTaskEXTPayloads;
      *piVar1 = *piVar1 + 1;
    }
    if (((((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) &&
         ((type.qualifier._8_4_ & 0x7f) < 0x1c)) &&
        ((0xe300008U >> (type.qualifier._8_4_ & 0x1f) & 1) != 0)) && (type._8_1_ == '\x0f')) {
      bVar4 = TQualifier::isArrayedIo
                        (&type.qualifier,
                         (this->super_TParseContextBase).super_TParseVersions.language);
      if (bVar4) {
        TType::TType((TType *)&symbol,&type,0,false);
        bVar4 = TType::
                contains<glslang::TType::containsArray()const::_lambda(glslang::TType_const*)_1_>
                          ((TType *)&symbol);
        if ((bVar4) &&
           (bVar4 = TType::
                    contains<glslang::TType::containsBuiltIn()const::_lambda(glslang::TType_const*)_1_>
                              ((TType *)&symbol), !bVar4)) {
          pTVar8 = TType::getTypeName_abi_cxx11_(&type);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,
                     "A per vertex structure containing an array is not allowed as input in ES",
                     (pTVar8->_M_dataplus)._M_p,"");
        }
      }
      else {
        bVar4 = TType::
                contains<glslang::TType::containsArray()const::_lambda(glslang::TType_const*)_1_>
                          (&type);
        if ((bVar4) &&
           (bVar4 = TType::
                    contains<glslang::TType::containsBuiltIn()const::_lambda(glslang::TType_const*)_1_>
                              (&type), !bVar4)) {
          pTVar8 = TType::getTypeName_abi_cxx11_(&type);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"A structure containing an array is not allowed as input in ES",
                     (pTVar8->_M_dataplus)._M_p,"");
        }
      }
      bVar4 = TType::containsStructure(&type);
      if (bVar4) {
        pTVar8 = TType::getTypeName_abi_cxx11_(&type);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"A structure containing an struct is not allowed as input in ES",
                   (pTVar8->_M_dataplus)._M_p,"");
      }
    }
    qualifier = &type.qualifier;
    bVar4 = std::operator!=(identifier,"gl_FragCoord");
    if ((bVar4) &&
       (((publicType->shaderQualifiers).originUpperLeft != false ||
        ((publicType->shaderQualifiers).pixelCenterInteger == true)))) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply origin_upper_left and pixel_center_origin to gl_FragCoord"
                 ,"layout qualifier","");
    }
    bVar4 = std::operator!=(identifier,"gl_FragDepth");
    if ((bVar4) && ((publicType->shaderQualifiers).layoutDepth != EldNone)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply depth layout to gl_FragDepth","layout qualifier","");
    }
    bVar4 = std::operator!=(identifier,"gl_FragStencilRefARB");
    if ((bVar4) && ((publicType->shaderQualifiers).layoutStencil != ElsNone)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply depth layout to gl_FragStencilRefARB","layout qualifier",
                 "");
    }
    pTVar13 = (TArraySizes *)&publicType->shaderQualifiers;
    pTVar9 = redeclareBuiltinVariable(this,loc,identifier,qualifier,(TShaderQualifiers *)pTVar13);
    symbol = pTVar9;
    if ((((pTVar9 != (TSymbol *)0x0) ||
         (reservedErrorCheck(this,loc,identifier),
         (this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan < 1)) ||
        ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed != true)) ||
       (bVar4 = vkRelaxedRemapUniformVariable
                          (this,loc,identifier,publicType,pTVar13,initializer,&type), !bVar4)) {
      inheritGlobalDefaults(this,qualifier);
      if (type.arraySizes == (TArraySizes *)0x0) {
        if (pTVar9 == (TSymbol *)0x0) {
          symbol = &declareNonArray(this,loc,identifier,&type)->super_TSymbol;
        }
        else {
          iVar5 = (*pTVar9->_vptr_TSymbol[0xc])(pTVar9);
          bVar4 = TType::operator!=(&type,(TType *)CONCAT44(extraout_var,iVar5));
          if (bVar4) {
            iVar5 = (*pTVar9->_vptr_TSymbol[3])(pTVar9);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"cannot change the type of","redeclaration",
                       *(undefined8 *)(CONCAT44(extraout_var_00,iVar5) + 8));
          }
        }
      }
      else {
        arraySizesCheck(this,loc,qualifier,type.arraySizes,initializer,false);
        arrayQualifierError(this,loc,qualifier);
        arrayError(this,loc,&type);
        declareArray(this,loc,identifier,&type,&symbol);
        if (initializer != (TIntermTyped *)0x0) {
          TParseVersions::profileRequires
                    ((TParseVersions *)this,loc,1,0x78,"GL_3DL_array_objects","initializer");
          TParseVersions::profileRequires
                    ((TParseVersions *)this,loc,8,300,(char *)0x0,"initializer");
        }
      }
      if (symbol != (TSymbol *)0x0) {
        if (initializer == (TIntermTyped *)0x0) {
          pTVar10 = (TIntermNode *)0x0;
        }
        else {
          iVar5 = (*symbol->_vptr_TSymbol[9])(symbol);
          if ((TVariable *)CONCAT44(extraout_var_01,iVar5) == (TVariable *)0x0) {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"initializer requires a variable, not a member",
                       (identifier->_M_dataplus)._M_p,"");
            return (TIntermNode *)0x0;
          }
          pTVar10 = executeInitializer(this,loc,initializer,
                                       (TVariable *)CONCAT44(extraout_var_01,iVar5));
        }
        layoutObjectCheck(this,loc,symbol);
        fixOffset(this,loc,symbol);
        return pTVar10;
      }
    }
  }
  return (TIntermNode *)0x0;
}

Assistant:

TIntermNode* TParseContext::declareVariable(const TSourceLoc& loc, TString& identifier, const TPublicType& publicType,
    TArraySizes* arraySizes, TIntermTyped* initializer)
{
    // Make a fresh type that combines the characteristics from the individual
    // identifier syntax and the declaration-type syntax.
    TType type(publicType);
    type.transferArraySizes(arraySizes);
    type.copyArrayInnerSizes(publicType.arraySizes);
    arrayOfArrayVersionCheck(loc, type.getArraySizes());

    if (initializer) {
        if (type.getBasicType() == EbtRayQuery) {
            error(loc, "ray queries can only be initialized by using the rayQueryInitializeEXT intrinsic:", "=", identifier.c_str());
        } else if (type.getBasicType() == EbtHitObjectNV) {
            error(loc, "hit objects cannot be initialized using initializers", "=", identifier.c_str());
        }

    }

    if (type.isCoopMatKHR()) {
        intermediate.setUseVulkanMemoryModel();
        intermediate.setUseStorageBuffer();

        if (!publicType.typeParameters || !publicType.typeParameters->arraySizes ||
            publicType.typeParameters->arraySizes->getNumDims() != 4) {
            error(loc, "unexpected number type parameters", identifier.c_str(), "");
        }
        if (publicType.typeParameters) {
            if (!isTypeFloat(publicType.typeParameters->basicType) &&
                !isTypeInt(publicType.typeParameters->basicType) && publicType.typeParameters->basicType != EbtSpirvType) {
                error(loc, "expected 8, 16, 32, or 64 bit signed or unsigned integer or 16, 32, or 64 bit float type", identifier.c_str(), "");
            }
        }
    }
    else if (type.isCoopMatNV()) {
        intermediate.setUseVulkanMemoryModel();
        intermediate.setUseStorageBuffer();

        if (!publicType.typeParameters || !publicType.typeParameters->arraySizes || publicType.typeParameters->arraySizes->getNumDims() != 4) {
            error(loc, "expected four type parameters", identifier.c_str(), "");
        } else {
            if (isTypeFloat(publicType.basicType) &&
                publicType.typeParameters->arraySizes->getDimSize(0) != 16 &&
                publicType.typeParameters->arraySizes->getDimSize(0) != 32 &&
                publicType.typeParameters->arraySizes->getDimSize(0) != 64) {
                error(loc, "expected 16, 32, or 64 bits for first type parameter", identifier.c_str(), "");
            }
            if (isTypeInt(publicType.basicType) &&
                publicType.typeParameters->arraySizes->getDimSize(0) != 8 &&
                publicType.typeParameters->arraySizes->getDimSize(0) != 16 &&
                publicType.typeParameters->arraySizes->getDimSize(0) != 32) {
                error(loc, "expected 8, 16, or 32 bits for first type parameter", identifier.c_str(), "");
            }
        }
    } else if (type.isTensorLayoutNV()) {
        if (!publicType.typeParameters || publicType.typeParameters->arraySizes->getNumDims() > 2) {
            error(loc, "expected 1-2 type parameters", identifier.c_str(), "");
        }
    } else if (type.isTensorViewNV()) {
        if (!publicType.typeParameters || publicType.typeParameters->arraySizes->getNumDims() > 7) {
            error(loc, "expected 1-7 type parameters", identifier.c_str(), "");
        }
    } else if (type.isCoopVecNV()) {
        intermediate.setUseVulkanMemoryModel();
        intermediate.setUseStorageBuffer();

        if (!publicType.typeParameters || !publicType.typeParameters->arraySizes || publicType.typeParameters->arraySizes->getNumDims() != 1) {
            error(loc, "expected two type parameters", identifier.c_str(), "");
        } else if (publicType.typeParameters->arraySizes->getDimSize(0) <= 0) {
            error(loc, "expected positive number of components", identifier.c_str(), "");
        }
    } else {
        if (publicType.typeParameters && publicType.typeParameters->arraySizes->getNumDims() != 0) {
            error(loc, "unexpected type parameters", identifier.c_str(), "");
        }
    }

    if (voidErrorCheck(loc, identifier, type.getBasicType()))
        return nullptr;

    if (initializer)
        rValueErrorCheck(loc, "initializer", initializer);
    else
        nonInitConstCheck(loc, identifier, type);

    samplerCheck(loc, type, identifier, initializer);
    transparentOpaqueCheck(loc, type, identifier);
    atomicUintCheck(loc, type, identifier);
    accStructCheck(loc, type, identifier);
    hitObjectNVCheck(loc, type, identifier);
    checkAndResizeMeshViewDim(loc, type, /*isBlockMember*/ false);
    if (type.getQualifier().storage == EvqConst && type.containsReference()) {
        error(loc, "variables with reference type can't have qualifier 'const'", "qualifier", "");
    }

    if (type.getQualifier().storage != EvqUniform && type.getQualifier().storage != EvqBuffer) {
        if (type.contains16BitFloat())
            requireFloat16Arithmetic(loc, "qualifier", "float16 types can only be in uniform block or buffer storage");
        if (type.contains16BitInt())
            requireInt16Arithmetic(loc, "qualifier", "(u)int16 types can only be in uniform block or buffer storage");
        if (type.contains8BitInt())
            requireInt8Arithmetic(loc, "qualifier", "(u)int8 types can only be in uniform block or buffer storage");
    }

    if (type.getQualifier().storage == EvqtaskPayloadSharedEXT)
        intermediate.addTaskPayloadEXTCount();
    if (type.getQualifier().storage == EvqShared && type.containsCoopMat())
        error(loc, "qualifier", "Cooperative matrix types must not be used in shared memory", "");

    if (profile == EEsProfile) {
        if (type.getQualifier().isPipeInput() && type.getBasicType() == EbtStruct) {
            if (type.getQualifier().isArrayedIo(language)) {
                TType perVertexType(type, 0);
                if (perVertexType.containsArray() && perVertexType.containsBuiltIn() == false) {
                    error(loc, "A per vertex structure containing an array is not allowed as input in ES", type.getTypeName().c_str(), "");
                }
            }
            else if (type.containsArray() && type.containsBuiltIn() == false) {
                error(loc, "A structure containing an array is not allowed as input in ES", type.getTypeName().c_str(), "");
            }
            if (type.containsStructure())
                error(loc, "A structure containing an struct is not allowed as input in ES", type.getTypeName().c_str(), "");
        }
    }

    if (identifier != "gl_FragCoord" && (publicType.shaderQualifiers.originUpperLeft || publicType.shaderQualifiers.pixelCenterInteger))
        error(loc, "can only apply origin_upper_left and pixel_center_origin to gl_FragCoord", "layout qualifier", "");
    if (identifier != "gl_FragDepth" && publicType.shaderQualifiers.getDepth() != EldNone)
        error(loc, "can only apply depth layout to gl_FragDepth", "layout qualifier", "");
    if (identifier != "gl_FragStencilRefARB" && publicType.shaderQualifiers.getStencil() != ElsNone)
        error(loc, "can only apply depth layout to gl_FragStencilRefARB", "layout qualifier", "");

    // Check for redeclaration of built-ins and/or attempting to declare a reserved name
    TSymbol* symbol = redeclareBuiltinVariable(loc, identifier, type.getQualifier(), publicType.shaderQualifiers);
    if (symbol == nullptr)
        reservedErrorCheck(loc, identifier);

    if (symbol == nullptr && spvVersion.vulkan > 0 && spvVersion.vulkanRelaxed) {
        bool remapped = vkRelaxedRemapUniformVariable(loc, identifier, publicType, arraySizes, initializer, type);

        if (remapped) {
            return nullptr;
        }
    }

    inheritGlobalDefaults(type.getQualifier());

    // Declare the variable
    if (type.isArray()) {
        // Check that implicit sizing is only where allowed.
        arraySizesCheck(loc, type.getQualifier(), type.getArraySizes(), initializer, false);

        if (! arrayQualifierError(loc, type.getQualifier()) && ! arrayError(loc, type))
            declareArray(loc, identifier, type, symbol);

        if (initializer) {
            profileRequires(loc, ENoProfile, 120, E_GL_3DL_array_objects, "initializer");
            profileRequires(loc, EEsProfile, 300, nullptr, "initializer");
        }
    } else {
        // non-array case
        if (symbol == nullptr)
            symbol = declareNonArray(loc, identifier, type);
        else if (type != symbol->getType())
            error(loc, "cannot change the type of", "redeclaration", symbol->getName().c_str());
    }

    if (symbol == nullptr)
        return nullptr;

    // Deal with initializer
    TIntermNode* initNode = nullptr;
    if (symbol != nullptr && initializer) {
        TVariable* variable = symbol->getAsVariable();
        if (! variable) {
            error(loc, "initializer requires a variable, not a member", identifier.c_str(), "");
            return nullptr;
        }
        initNode = executeInitializer(loc, initializer, variable);
    }

    // look for errors in layout qualifier use
    layoutObjectCheck(loc, *symbol);

    // fix up
    fixOffset(loc, *symbol);

    return initNode;
}